

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelPackage.cpp
# Opt level: O2

void __thiscall MPL::detail::ModelPackageImpl::validate(ModelPackageImpl *this)

{
  JsonMap *this_00;
  unique_ptr<JsonMap,_std::default_delete<JsonMap>_> uVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  istream *piVar6;
  runtime_error *prVar7;
  pointer __rhs;
  allocator<char> local_2c1;
  unique_ptr<JsonMap,_std::default_delete<JsonMap>_> itemInfoEntry;
  allocator<char> local_2b3;
  allocator<char> local_2b2;
  allocator<char> local_2b1;
  string token;
  unique_ptr<JsonMap,_std::default_delete<JsonMap>_> itemInfoEntries;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  versionTokens;
  path local_260;
  path *local_238;
  _Alloc_hider local_230;
  string versionString;
  string local_208;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  identifiers;
  string local_1d0;
  istringstream versionStringStream;
  
  this_00 = (this->m_manifest)._M_t.super___uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>.
            _M_t.super__Tuple_impl<0UL,_JsonMap_*,_std::default_delete<JsonMap>_>.
            super__Head_base<0UL,_JsonMap_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&versionStringStream,"fileFormatVersion",(allocator<char> *)&token);
  JsonMap::getString(&versionString,this_00,(string *)&versionStringStream);
  std::__cxx11::string::~string((string *)&versionStringStream);
  std::__cxx11::istringstream::istringstream
            ((istringstream *)&versionStringStream,(string *)&versionString,_S_in);
  versionTokens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  versionTokens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  versionTokens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  token._M_dataplus._M_p = (pointer)&token.field_2;
  token._M_string_length = 0;
  token.field_2._M_local_buf[0] = '\0';
  while( true ) {
    piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&versionStringStream,(string *)&token,'.');
    if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&versionTokens,&token);
  }
  std::__cxx11::string::~string((string *)&token);
  if ((long)versionTokens.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)versionTokens.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != 0x60) {
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&token,
                   "File format version must be in the form of major.minor.patch, but the specified value was: "
                   ,&versionString);
    std::runtime_error::runtime_error(prVar7,(string *)&token);
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar3 = std::__cxx11::stoi(versionTokens.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,(size_t *)0x0,10);
  uVar4 = std::__cxx11::stoi(versionTokens.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + 1,(size_t *)0x0,10);
  uVar5 = std::__cxx11::stoi(versionTokens.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + 2,(size_t *)0x0,10);
  if ((int)(uVar4 | uVar3 | uVar5) < 0) {
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&token,"File format version uses negative number(s): ",&versionString);
    std::runtime_error::runtime_error(prVar7,(string *)&token);
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((int)uVar3 < 2) {
    if ((uVar3 != 1 || (int)uVar4 < 1) && ((int)uVar5 < 1 || uVar4 != 0)) {
      getItemInfoEntries((ModelPackageImpl *)&itemInfoEntries);
      if ((__uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>)
          itemInfoEntries._M_t.super___uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>._M_t.
          super__Tuple_impl<0UL,_JsonMap_*,_std::default_delete<JsonMap>_>.
          super__Head_base<0UL,_JsonMap_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>)0x0) {
        identifiers.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        identifiers.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        identifiers.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        JsonMap::getKeys((JsonMap *)
                         itemInfoEntries._M_t.
                         super___uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>._M_t.
                         super__Tuple_impl<0UL,_JsonMap_*,_std::default_delete<JsonMap>_>.
                         super__Head_base<0UL,_JsonMap_*,_false>._M_head_impl,&identifiers);
        local_230._M_p =
             (pointer)identifiers.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
        local_238 = &this->m_packageDataDirPath;
        for (__rhs = identifiers.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; __rhs != (pointer)local_230._M_p;
            __rhs = __rhs + 1) {
          getItemInfoEntry((ModelPackageImpl *)&itemInfoEntry,(string *)this);
          uVar1 = itemInfoEntry;
          std::__cxx11::string::string<std::allocator<char>>((string *)&token,"path",&local_2c1);
          bVar2 = JsonMap::hasKey((JsonMap *)
                                  uVar1._M_t.
                                  super___uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>._M_t
                                  .super__Tuple_impl<0UL,_JsonMap_*,_std::default_delete<JsonMap>_>.
                                  super__Head_base<0UL,_JsonMap_*,_false>._M_head_impl,&token);
          uVar1 = itemInfoEntry;
          if (!bVar2) {
LAB_0012dffc:
            std::__cxx11::string::~string((string *)&token);
LAB_0012e006:
            prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::operator+(&token,"Invalid itemInfo for identifier: ",__rhs);
            std::runtime_error::runtime_error(prVar7,(string *)&token);
            __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,"name",&local_2b1)
          ;
          bVar2 = JsonMap::hasKey((JsonMap *)
                                  uVar1._M_t.
                                  super___uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>._M_t
                                  .super__Tuple_impl<0UL,_JsonMap_*,_std::default_delete<JsonMap>_>.
                                  super__Head_base<0UL,_JsonMap_*,_false>._M_head_impl,
                                  &local_260._M_pathname);
          uVar1 = itemInfoEntry;
          if (!bVar2) {
LAB_0012dff2:
            std::__cxx11::string::~string((string *)&local_260);
            goto LAB_0012dffc;
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_208,"author",&local_2b2);
          bVar2 = JsonMap::hasKey((JsonMap *)
                                  uVar1._M_t.
                                  super___uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>._M_t
                                  .super__Tuple_impl<0UL,_JsonMap_*,_std::default_delete<JsonMap>_>.
                                  super__Head_base<0UL,_JsonMap_*,_false>._M_head_impl,&local_208);
          uVar1 = itemInfoEntry;
          if (!bVar2) {
            std::__cxx11::string::~string((string *)&local_208);
            goto LAB_0012dff2;
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1d0,"description",&local_2b3);
          bVar2 = JsonMap::hasKey((JsonMap *)
                                  uVar1._M_t.
                                  super___uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>._M_t
                                  .super__Tuple_impl<0UL,_JsonMap_*,_std::default_delete<JsonMap>_>.
                                  super__Head_base<0UL,_JsonMap_*,_false>._M_head_impl,&local_1d0);
          std::__cxx11::string::~string((string *)&local_1d0);
          std::__cxx11::string::~string((string *)&local_208);
          std::__cxx11::string::~string((string *)&local_260);
          std::__cxx11::string::~string((string *)&token);
          uVar1 = itemInfoEntry;
          if (!bVar2) goto LAB_0012e006;
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"path",&local_2c1)
          ;
          JsonMap::getString(&local_208,
                             (JsonMap *)
                             uVar1._M_t.
                             super___uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>._M_t.
                             super__Tuple_impl<0UL,_JsonMap_*,_std::default_delete<JsonMap>_>.
                             super__Head_base<0UL,_JsonMap_*,_false>._M_head_impl,&local_1d0);
          std::filesystem::__cxx11::path::path(&local_260,&local_208,auto_format);
          std::filesystem::__cxx11::operator/((path *)&token,local_238,&local_260);
          std::filesystem::__cxx11::path::~path(&local_260);
          std::__cxx11::string::~string((string *)&local_208);
          std::__cxx11::string::~string((string *)&local_1d0);
          bVar2 = std::filesystem::exists((path *)&token);
          if (!bVar2) {
            prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::operator+(&local_260._M_pathname,"Item does not exist for identifier: ",__rhs);
            std::runtime_error::runtime_error(prVar7,(string *)&local_260);
            __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          std::filesystem::__cxx11::path::~path((path *)&token);
          std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::~unique_ptr(&itemInfoEntry);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&identifiers);
      }
      std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::~unique_ptr(&itemInfoEntries);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&versionTokens);
      std::__cxx11::istringstream::~istringstream((istringstream *)&versionStringStream);
      std::__cxx11::string::~string((string *)&versionString);
      return;
    }
  }
  prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&token,"Unsupported version: ",&versionString);
  std::runtime_error::runtime_error(prVar7,(string *)&token);
  __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ModelPackageImpl::validate()
{
    const std::string versionString = m_manifest->getString(kModelPackageFileFormatVersionKey);

    std::istringstream versionStringStream(versionString);
    std::vector<std::string> versionTokens;
    for (std::string token; std::getline(versionStringStream, token, '.');) {
        versionTokens.push_back(token);
    }

    if (versionTokens.size() != 3) {
        throw std::runtime_error("File format version must be in the form of major.minor.patch, but the specified value was: " + versionString);
    }

    int majorVersion = 0;
    int minorVersion = 0;
    int patchVersion = 0;
    try {
        majorVersion = std::stoi(versionTokens[0]);
        minorVersion = std::stoi(versionTokens[1]);
        patchVersion = std::stoi(versionTokens[2]);
    } catch (std::invalid_argument& e) {
        throw std::runtime_error("Failed to parse file format version: " + versionString + " because: " + e.what());
    }

    if (majorVersion < 0 ||
        minorVersion < 0 ||
        patchVersion < 0 ) {
        throw std::runtime_error("File format version uses negative number(s): " + versionString);
    }

    if ((majorVersion > kModelPackageFileFormatMajorVersion) ||
        (majorVersion == kModelPackageFileFormatMajorVersion && minorVersion > kModelPackageFileFormatMinorVersion) ||
        (minorVersion == kModelPackageFileFormatMinorVersion && patchVersion > kModelPackageFileFormatPatchVersion)) {
        throw std::runtime_error("Unsupported version: " + versionString);
    }
    
    // Validate 1.0.0 model package
    
    auto itemInfoEntries = getItemInfoEntries();
    if (itemInfoEntries != nullptr) {
        std::vector<std::string> identifiers;
        itemInfoEntries->getKeys(identifiers);
        for (const auto& identifier : identifiers) {
            auto itemInfoEntry = getItemInfoEntry(identifier);
            
            if (false == itemInfoEntry->hasKey(kModelPackageItemInfoPathKey) ||
                false == itemInfoEntry->hasKey(kModelPackageItemInfoNameKey) ||
                false == itemInfoEntry->hasKey(kModelPackageItemInfoAuthorKey) ||
                false == itemInfoEntry->hasKey(kModelPackageItemInfoDescriptionKey)) {
                throw std::runtime_error("Invalid itemInfo for identifier: " + identifier);
            }
            
            auto path = m_packageDataDirPath / itemInfoEntry->getString(kModelPackageItemInfoPathKey);
            if (false == exists(path)) {
                throw std::runtime_error("Item does not exist for identifier: " + identifier);
            }
        }
    }
}